

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
          (InternalMetadata *this)

{
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  InternalMetadata *this_local;
  
  this_00 = PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                      (this);
  if (this_00 !=
      (Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )0x0) {
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Container(this_00);
    operator_delete(this_00,0x28);
  }
  this->ptr_ = 0;
  return;
}

Assistant:

PROTOBUF_NOINLINE void DeleteOutOfLineHelper() {
    delete PtrValue<Container<T>>();
    // TODO:  This store is load-bearing.  Since we are destructing
    // the message at this point, see if we can eliminate it.
    ptr_ = 0;
  }